

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.cc
# Opt level: O3

void __thiscall iqxmlrpc::Server::work(Server *this)

{
  Acceptor *pAVar1;
  Reactor_base *pRVar2;
  int iVar3;
  Acceptor *this_00;
  Impl *pIVar4;
  
  pIVar4 = this->impl;
  if ((pIVar4->acceptor)._M_ptr == (Acceptor *)0x0) {
    this_00 = (Acceptor *)operator_new(0x48);
    iqnet::Acceptor::Acceptor
              (this_00,&pIVar4->bind_addr,(pIVar4->conn_factory)._M_ptr,(pIVar4->reactor)._M_ptr);
    pAVar1 = (pIVar4->acceptor)._M_ptr;
    if (pAVar1 != this_00) {
      if (pAVar1 != (Acceptor *)0x0) {
        (*(pAVar1->super_Event_handler)._vptr_Event_handler[1])();
      }
      (pIVar4->acceptor)._M_ptr = this_00;
    }
    iqnet::Acceptor::set_firewall((this->impl->acceptor)._M_ptr,this->impl->firewall);
  }
  do {
    pIVar4 = this->impl;
    if (pIVar4->exit_flag != false) goto LAB_00166d6b;
    pRVar2 = (pIVar4->reactor)._M_ptr;
    iVar3 = (*pRVar2->_vptr_Reactor_base[6])(pRVar2,0xffffffff);
  } while ((char)iVar3 != '\0');
  pIVar4 = this->impl;
LAB_00166d6b:
  pAVar1 = (pIVar4->acceptor)._M_ptr;
  if (pAVar1 != (Acceptor *)0x0) {
    (*(pAVar1->super_Event_handler)._vptr_Event_handler[1])();
    (pIVar4->acceptor)._M_ptr = (Acceptor *)0x0;
    pIVar4 = this->impl;
  }
  pIVar4->exit_flag = false;
  return;
}

Assistant:

void Server::work()
{
  if( !impl->acceptor.get() )
  {
    impl->acceptor.reset(new iqnet::Acceptor( impl->bind_addr, get_conn_factory(), get_reactor()));
    impl->acceptor->set_firewall( impl->firewall );
  }

  for(bool have_handlers = true; have_handlers;)
  {
    if (impl->exit_flag)
      break;

    have_handlers = get_reactor()->handle_events();
  }

  impl->acceptor.reset(0);
  impl->exit_flag = false;
}